

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode baller_start(Curl_cfilter *cf,Curl_easy *data,eyeballer *baller,timediff_t timeoutms)

{
  Curl_cfilter **pcf;
  int iVar1;
  Curl_cfilter *pCVar2;
  curl_trc_feat *pcVar3;
  connectdata *pcVar4;
  CURLcode CVar5;
  undefined8 in_RAX;
  Curl_addrinfo *pCVar6;
  Curl_cfilter *pCVar7;
  byte bVar8;
  curltime cVar9;
  Curl_cfilter *local_38;
  
  baller->error = 0;
  pCVar6 = (Curl_addrinfo *)
           (CONCAT71((int7)((ulong)in_RAX >> 8),baller->field_0x64) & 0xfffffffffffffff5 | 2);
  baller->field_0x64 = (char)pCVar6;
  if (baller->addr == (Curl_addrinfo *)0x0) {
LAB_0011cb3d:
    baller->field_0x64 = baller->field_0x64 | 4;
LAB_0011cb41:
    return (CURLcode)pCVar6;
  }
  pcf = &baller->cf;
  do {
    cVar9 = Curl_now();
    (baller->started).tv_sec = cVar9.tv_sec;
    (baller->started).tv_usec = cVar9.tv_usec;
    pCVar6 = baller->addr;
    do {
      if ((pCVar6 == (Curl_addrinfo *)0x0) ||
         (pCVar6 = pCVar6->ai_next, pCVar6 == (Curl_addrinfo *)0x0)) {
        bVar8 = 0;
        goto LAB_0011ca17;
      }
    } while (pCVar6->ai_family != baller->ai_family);
    bVar8 = 1;
LAB_0011ca17:
    baller->timeoutms = (ulong)timeoutms >> (600 < timeoutms & bVar8);
    pCVar2 = baller->cf;
    local_38 = pCVar2;
    CVar5 = (*baller->cf_create)(pcf,data,cf->conn,baller->addr,*cf->ctx);
    if (CVar5 == CURLE_OK) {
      pCVar7 = *pcf;
      if (pCVar7 != (Curl_cfilter *)0x0) {
        pcVar4 = cf->conn;
        iVar1 = cf->sockindex;
        do {
          pCVar7->conn = pcVar4;
          pCVar7->sockindex = iVar1;
          pCVar7 = pCVar7->next;
        } while (pCVar7 != (Curl_cfilter *)0x0);
      }
      pCVar6 = baller->addr;
      do {
        if ((pCVar6 == (Curl_addrinfo *)0x0) ||
           (pCVar6 = pCVar6->ai_next, pCVar6 == (Curl_addrinfo *)0x0)) goto LAB_0011caf4;
      } while (pCVar6->ai_family != baller->ai_family);
      Curl_expire(data,baller->timeoutms,baller->timeout_id);
    }
    else {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"%s failed",baller->name);
      }
      if (*pcf != (Curl_cfilter *)0x0) {
        Curl_conn_cf_discard_chain(pcf,data);
      }
    }
LAB_0011caf4:
    if (pCVar2 != (Curl_cfilter *)0x0) {
      Curl_conn_cf_discard_chain(&local_38,data);
    }
    baller->result = CVar5;
    pCVar6 = baller->addr;
    if (CVar5 == CURLE_OK) {
      if (pCVar6 == (Curl_addrinfo *)0x0) goto LAB_0011cb3d;
      goto LAB_0011cb41;
    }
    do {
      if ((pCVar6 == (Curl_addrinfo *)0x0) ||
         (pCVar6 = pCVar6->ai_next, pCVar6 == (Curl_addrinfo *)0x0)) {
        baller->addr = (Curl_addrinfo *)0x0;
        goto LAB_0011cb3d;
      }
    } while (pCVar6->ai_family != baller->ai_family);
    baller->addr = pCVar6;
  } while( true );
}

Assistant:

static CURLcode baller_start(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             struct eyeballer *baller,
                             timediff_t timeoutms)
{
  baller->error = 0;
  baller->connected = FALSE;
  baller->has_started = TRUE;

  while(baller->addr) {
    baller->started = Curl_now();
    baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
      USETIME(timeoutms) : timeoutms;
    baller_initiate(cf, data, baller);
    if(!baller->result)
      break;
    baller_next_addr(baller);
  }
  if(!baller->addr) {
    baller->is_done = TRUE;
  }
  return baller->result;
}